

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_mul_div_randomized_Test::TestBody(correctness_mul_div_randomized_Test *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  big_integer *in_stack_00000008;
  big_integer *in_stack_00000010;
  big_integer *in_stack_00000018;
  big_integer *in_stack_00000020;
  AssertionResult gtest_ar_;
  size_t i_2;
  size_t i_1;
  big_integer accumulator;
  size_t i;
  vector<int,_std::allocator<int>_> multipliers;
  uint itn;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe80;
  Type in_stack_fffffffffffffe8c;
  AssertHelper *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  AssertionResult *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  size_type local_d8;
  size_type local_88;
  long local_30;
  vector<int,_std::allocator<int>_> local_28;
  int local_c;
  
  for (local_c = 0; local_c != 10; local_c = local_c + 1) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x124065);
    for (local_30 = 0; local_30 != 1000; local_30 = local_30 + 1) {
      in_stack_fffffffffffffe74 = anon_unknown.dwarf_998c::myrand();
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                 (value_type_conflict *)
                 CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    }
    big_integer::big_integer
              ((big_integer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    for (local_88 = 0; local_88 != 1000; local_88 = local_88 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_28,local_88);
      big_integer::big_integer
                ((big_integer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      big_integer::operator*=(in_stack_00000020,in_stack_00000018);
      big_integer::~big_integer
                ((big_integer *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
    }
    in_stack_fffffffffffffe68 = &local_28;
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    __last._M_current._4_4_ = in_stack_fffffffffffffe7c;
    __last._M_current._0_4_ = in_stack_fffffffffffffe78;
    std::random_shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (in_stack_fffffffffffffe80,__last);
    for (local_d8 = 1; local_d8 != 1000; local_d8 = local_d8 + 1) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_28,local_d8);
      big_integer::big_integer
                ((big_integer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      big_integer::operator/=(in_stack_00000010,in_stack_00000008);
      big_integer::~big_integer
                ((big_integer *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
    }
    std::vector<int,_std::allocator<int>_>::operator[](&local_28,0);
    big_integer::big_integer
              ((big_integer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    in_stack_fffffffffffffe67 =
         operator==((big_integer *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    (big_integer *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
               (bool)in_stack_fffffffffffffe5f);
    big_integer::~big_integer
              ((big_integer *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
    in_stack_fffffffffffffe66 =
         testing::AssertionResult::operator_cast_to_bool
                   ((AssertionResult *)&stack0xfffffffffffffee0);
    if (!(bool)in_stack_fffffffffffffe66) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                 (char *)in_stack_fffffffffffffe80._M_current,in_stack_fffffffffffffe7c,
                 (char *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
      testing::Message::~Message((Message *)0x1243db);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x12444a);
    big_integer::~big_integer
              ((big_integer *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  }
  return;
}

Assistant:

TEST(correctness, mul_div_randomized)
{
    for (unsigned itn = 0; itn != number_of_iterations; ++itn)
    {
        std::vector<int> multipliers;

        for (size_t i = 0; i != number_of_multipliers; ++i)
            multipliers.push_back(myrand());

        big_integer accumulator = 1;

        for (size_t i = 0; i != number_of_multipliers; ++i)
            accumulator *= multipliers[i];

        std::random_shuffle(multipliers.begin(), multipliers.end());

        for (size_t i = 1; i != number_of_multipliers; ++i) {
            accumulator /= multipliers[i];
        }

        EXPECT_TRUE(accumulator == multipliers[0]);
    }
}